

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::MessageOptions::Swap(MessageOptions *this,MessageOptions *other)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar4;
  
  if (other != this) {
    bVar1 = this->message_set_wire_format_;
    this->message_set_wire_format_ = other->message_set_wire_format_;
    other->message_set_wire_format_ = bVar1;
    bVar1 = this->no_standard_descriptor_accessor_;
    this->no_standard_descriptor_accessor_ = other->no_standard_descriptor_accessor_;
    other->no_standard_descriptor_accessor_ = bVar1;
    internal::RepeatedPtrFieldBase::Swap
              (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
               &(other->uninterpreted_option_).super_RepeatedPtrFieldBase);
    uVar2 = this->_has_bits_[0];
    this->_has_bits_[0] = other->_has_bits_[0];
    other->_has_bits_[0] = uVar2;
    pvVar4 = (this->_unknown_fields_).fields_;
    (this->_unknown_fields_).fields_ = (other->_unknown_fields_).fields_;
    (other->_unknown_fields_).fields_ = pvVar4;
    iVar3 = this->_cached_size_;
    this->_cached_size_ = other->_cached_size_;
    other->_cached_size_ = iVar3;
    internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
    return;
  }
  return;
}

Assistant:

void MessageOptions::Swap(MessageOptions* other) {
  if (other != this) {
    std::swap(message_set_wire_format_, other->message_set_wire_format_);
    std::swap(no_standard_descriptor_accessor_, other->no_standard_descriptor_accessor_);
    uninterpreted_option_.Swap(&other->uninterpreted_option_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
    _extensions_.Swap(&other->_extensions_);
  }
}